

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

vector<duckdb::LogicalType,_true> * duckdb::ArgMaxByTypes(void)

{
  vector<duckdb::LogicalType,_true> *extraout_RAX;
  long lVar1;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_f1;
  LogicalType local_f0 [4];
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType::LogicalType(local_f0,INTEGER);
  LogicalType::LogicalType(local_f0 + 1,BIGINT);
  LogicalType::LogicalType(local_f0 + 2,HUGEINT);
  LogicalType::LogicalType(local_f0 + 3,DOUBLE);
  LogicalType::LogicalType(&local_90,VARCHAR);
  LogicalType::LogicalType(&local_78,DATE);
  LogicalType::LogicalType(&local_60,TIMESTAMP);
  LogicalType::LogicalType(&local_48,TIMESTAMP_TZ);
  LogicalType::LogicalType(&local_30,BLOB);
  __l._M_len = 9;
  __l._M_array = local_f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_f1);
  lVar1 = 0xc0;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_f0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return extraout_RAX;
}

Assistant:

static const vector<LogicalType> ArgMaxByTypes() {
	vector<LogicalType> types = {LogicalType::INTEGER,   LogicalType::BIGINT,       LogicalType::HUGEINT,
	                             LogicalType::DOUBLE,    LogicalType::VARCHAR,      LogicalType::DATE,
	                             LogicalType::TIMESTAMP, LogicalType::TIMESTAMP_TZ, LogicalType::BLOB};
	return types;
}